

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O3

char * output_format_str(output_formats format)

{
  if (format < (MARKDOWN|JSON)) {
    return &DAT_0013f0b8 + *(int *)(&DAT_0013f0b8 + (ulong)format * 4);
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llama-bench/llama-bench.cpp"
             ,0x74,"invalid output format");
}

Assistant:

static const char * output_format_str(output_formats format) {
    switch (format) {
        case NONE:
            return "none";
        case CSV:
            return "csv";
        case JSON:
            return "json";
        case JSONL:
            return "jsonl";
        case MARKDOWN:
            return "md";
        case SQL:
            return "sql";
        default:
            GGML_ABORT("invalid output format");
    }
}